

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O3

void re2::REArgTestIntTest(void)

{
  ostringstream *poVar1;
  char cVar2;
  char *__s;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  int r;
  int local_1b4;
  LogMessage local_1b0;
  
  poVar1 = &local_1b0.str_;
  lVar5 = 0;
  do {
    __s = *(char **)((long)&kSuccessTable + lVar5);
    sVar4 = strlen(__s);
    bVar3 = RE2::Arg::parse_int(__s,(int)sVar4,&local_1b4);
    cVar2 = (&DAT_001460e2)[lVar5];
    if ((bool)cVar2 != bVar3) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Check failed: (retval) == (success)",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Parsing \'",9);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\' for type int should return ",0x1d);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    if ((cVar2 != '\0') && (local_1b4 != *(int *)((long)&DAT_001460d8 + lVar5))) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: (r) == ((int)kSuccessTable[i].value)",
                 0x32);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 600);
  return;
}

Assistant:

TEST(REArgTest, IntTest) {
  PARSE_FOR_TYPE(int, 2);
}

TEST(REArgTest, UInt32Test) {
  PARSE_FOR_TYPE(uint32, 3);
}

TEST(REArgTest, Iint64Test) {
  PARSE_FOR_TYPE(int64, 4);
}

TEST(REArgTest, Uint64Test) {
  PARSE_FOR_TYPE(uint64, 5);
}

}